

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

char * __thiscall
adios2::format::BP5Serializer::BuildArrayDimsName
          (BP5Serializer *this,char *base_name,int type,int element_size)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  uint in_ECX;
  uint in_EDX;
  char *in_RSI;
  char *Ret;
  size_t Len;
  char *Prefix;
  
  __s = NamePrefix(GlobalArray);
  sVar1 = strlen(in_RSI);
  sVar2 = strlen(__s);
  sVar1 = sVar1 + sVar2 + 0x13;
  __s_00 = (char *)malloc(sVar1);
  snprintf(__s_00,sVar1,"%s%d_%d_",__s,(ulong)in_ECX,(ulong)in_EDX);
  strcat(__s_00,in_RSI);
  strcat(__s_00,"Dims");
  return __s_00;
}

Assistant:

char *BP5Serializer::BuildArrayDimsName(const char *base_name, const int type,
                                        const int element_size)
{
    const char *Prefix = NamePrefix(ShapeID::GlobalArray);
    size_t Len = strlen(base_name) + 3 + strlen(Prefix) + 16;
    char *Ret = (char *)malloc(Len);
    snprintf(Ret, Len, "%s%d_%d_", Prefix, element_size, type);
    strcat(Ret, base_name);
    strcat(Ret, "Dims");
    return Ret;
}